

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll-test.c
# Opt level: O3

void shutdown_behavior_impl(_func_void_int_ptr *fd_fun)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  ssize_t sVar5;
  char *pcVar6;
  undefined8 uVar7;
  int iVar8;
  char c;
  int fds [3];
  epoll_event event;
  epoll_event event_result;
  uint8_t data [512];
  undefined1 local_265;
  int local_264;
  int local_260;
  int local_25c;
  undefined1 local_258 [16];
  int local_248;
  _func_void_int_ptr *local_240;
  undefined1 local_238 [520];
  
  iVar1 = epoll_create1(0x80000);
  if (iVar1 < 0) {
    pcVar6 = "ep >= 0";
    uVar7 = 0x601;
  }
  else {
    connector_epfd = iVar1;
    local_240 = fd_fun;
    (*fd_fun)(&local_264);
    connector_epfd = -1;
    local_265 = 0x2a;
    write(local_264,&local_265,1);
    local_258._0_4_ = 5;
    local_258._4_4_ = local_260;
    epoll_ctl(iVar1,1,local_260,(epoll_event *)local_258);
    piVar4 = __errno_location();
    *piVar4 = 0;
    iVar2 = epoll_wait(iVar1,(epoll_event *)(local_258 + 0xc),1,-1);
    if (iVar2 == 1) {
      iVar2 = 0;
      do {
        if (local_248 != local_260) {
          pcVar6 = "event_result.data.fd == fds[1]";
          uVar7 = 0x61a;
          goto LAB_00108dcb;
        }
        if ((local_258._12_4_ & 1) == 0) {
          if (local_258._12_4_ != 4) {
            if ((~local_258._12_4_ & 0x14) == 0 && local_240 == fd_domain_socket) {
              shutdown_behavior_impl_cold_3();
            }
            else if (local_258._12_4_ == 0x1c && local_240 == fd_tcp_socket) {
              shutdown_behavior_impl_cold_2();
            }
            else {
              if ((local_240 != fd_tcp_socket) || (local_258._12_4_ != 0x14)) {
                microatf_fail_require
                          ("%s:%d: %p(%p/%p): events %x",
                           "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
                           ,0x660,local_240,fd_domain_socket,fd_tcp_socket,local_258._12_4_);
              }
              shutdown_behavior_impl_cold_1();
            }
            iVar2 = close(local_260);
            if (iVar2 != 0) {
              pcVar6 = "close(fds[1]) == 0";
              uVar7 = 0x664;
              goto LAB_00108dcb;
            }
            if (local_25c != -1) {
              iVar2 = close(local_25c);
              if (iVar2 != 0) {
                pcVar6 = "fds[2] == -1 || close(fds[2]) == 0";
                uVar7 = 0x665;
                goto LAB_00108dcb;
              }
            }
            iVar1 = close(iVar1);
            if (iVar1 == 0) {
              return;
            }
            pcVar6 = "close(ep) == 0";
            uVar7 = 0x666;
            goto LAB_00108dcb;
          }
          send(local_258._4_4_,&local_265,1,0x4000);
          iVar8 = iVar2;
        }
        else {
          sVar5 = read(local_248,&local_265,1);
          if ((int)sVar5 != 1) {
            pcVar6 = "(n = (int)read(fds[1], &c, 1)) == 1";
            uVar7 = 0x621;
            goto LAB_00108dcb;
          }
          iVar8 = iVar2 + 1;
          if (iVar2 < 5) {
            send(local_264,&local_265,1,0x4000);
          }
          else if (iVar8 == 6) {
            send(local_264,&local_265,1,0x4000);
            shutdown(local_264,1);
            usleep(100000);
            iVar8 = 6;
          }
          else {
            memset(local_238,0,0x200);
            send(local_260,local_238,0x200,0x4000);
            close(local_264);
            local_258._0_4_ = 4;
            local_258._4_4_ = local_260;
            iVar2 = epoll_ctl(iVar1,3,local_260,(epoll_event *)local_258);
            if (iVar2 != 0) {
              pcVar6 = "epoll_ctl(ep, EPOLL_CTL_MOD, fds[1], &event) == 0";
              uVar7 = 0x635;
              goto LAB_00108dcb;
            }
            usleep(100000);
          }
        }
        iVar3 = epoll_wait(iVar1,(epoll_event *)(local_258 + 0xc),1,-1);
        iVar2 = iVar8;
      } while (iVar3 == 1);
    }
    pcVar6 = "(n = epoll_wait(ep, &event_result, 1, -1)) == 1";
    uVar7 = 0x618;
  }
LAB_00108dcb:
  microatf_fail_require
            ("%s:%d: %s not met",
             "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
             ,uVar7,pcVar6);
}

Assistant:

static void
shutdown_behavior_impl(void (*fd_fun)(int fds[3]))
{
	int ep = epoll_create1(EPOLL_CLOEXEC);
	ATF_REQUIRE(ep >= 0);

	connector_epfd = ep;

	int fds[3];
	fd_fun(fds);

	connector_epfd = -1;

	int counter = 0;
	char c = 42;
	write(fds[0], &c, 1);

	struct epoll_event event;
	event.events = EPOLLOUT | EPOLLIN;
	event.data.fd = fds[1];
	epoll_ctl(ep, EPOLL_CTL_ADD, fds[1], &event);

	errno = 0;

	for (;;) {
		struct epoll_event event_result;
		int n;
		ATF_REQUIRE((n = epoll_wait(ep, &event_result, 1, -1)) == 1);

		ATF_REQUIRE(event_result.data.fd == fds[1]);

		// fprintf(stderr, "got event: %x %d\n",
		// (int)event_result.events,
		//     (int)event_result.events);

		if (event_result.events & EPOLLIN) {
			ATF_REQUIRE((n = (int)read(fds[1], &c, 1)) == 1);

			++counter;

			if (counter <= 5) {
				send(fds[0], &c, 1, MSG_NOSIGNAL);
			} else if (counter == 6) {
				send(fds[0], &c, 1, MSG_NOSIGNAL);
				shutdown(fds[0], SHUT_WR);

				usleep(100000);
			} else {
				uint8_t data[512] = { 0 };
				send(fds[1], &data, sizeof(data), MSG_NOSIGNAL);

				close(fds[0]);

				event.events = EPOLLOUT;
				event.data.fd = fds[1];
				ATF_REQUIRE(epoll_ctl(ep, EPOLL_CTL_MOD, /**/
						fds[1], &event) == 0);

				usleep(100000);
			}

		} else if (event_result.events == EPOLLOUT) {
			send(event.data.fd, &c, 1, MSG_NOSIGNAL);
			// continue
		} else if (fd_fun == fd_domain_socket &&
		    (event_result.events & (EPOLLOUT | EPOLLHUP)) ==
			(EPOLLOUT | EPOLLHUP)) {
			// TODO(jan): Linux sets EPOLLERR in addition
			{
				int error = 0;
				socklen_t errlen = sizeof(error);
				getsockopt(fds[1], SOL_SOCKET, SO_ERROR,
				    (void *)&error, &errlen);
				fprintf(stderr, "socket error: %d (%s)\n",
				    error, strerror(error));
			}
			break;
		} else if (fd_fun == fd_tcp_socket &&
		    event_result.events == (EPOLLOUT | EPOLLERR | EPOLLHUP)) {
			{
				int error = 0;
				socklen_t errlen = sizeof(error);
				getsockopt(fds[1], SOL_SOCKET, SO_ERROR,
				    (void *)&error, &errlen);
				fprintf(stderr, "socket error: %d (%s)\n",
				    error, strerror(error));
			}
			break;
		} else if (fd_fun == fd_tcp_socket &&
		    event_result.events == (EPOLLOUT | EPOLLHUP)) {
			/*
			 * Rarely, we get here (no EPOLLERR). But don't fail
			 * the test. There is some non-determinism involved...
			 */
			fprintf(stderr, "no socket error\n");
			break;
		} else {
			ATF_REQUIRE_MSG(false, "%p(%p/%p): events %x",
			    (void *)fd_fun, (void *)fd_domain_socket,
			    (void *)fd_tcp_socket, event_result.events);
		}
	}

	ATF_REQUIRE(close(fds[1]) == 0);
	ATF_REQUIRE(fds[2] == -1 || close(fds[2]) == 0);
	ATF_REQUIRE(close(ep) == 0);
}